

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::LayeredRenderCase::verifyEmptyImage
          (LayeredRenderCase *this,Surface *layer,bool logging)

{
  RGBA RVar1;
  int iVar2;
  int iVar3;
  TestLog *pTVar4;
  MessageBuilder *pMVar5;
  bool local_659;
  MessageBuilder local_638;
  allocator<char> local_4b1;
  string local_4b0;
  allocator<char> local_489;
  string local_488;
  LogImage local_468;
  allocator<char> local_3d1;
  string local_3d0;
  allocator<char> local_3a9;
  string local_3a8;
  LogImageSet local_388;
  MessageBuilder local_348;
  bool local_1c5;
  undefined4 local_1c4;
  RGBA RStack_1c0;
  bool isBlack;
  int threshold;
  RGBA color;
  int x;
  int y;
  MessageBuilder local_1a8;
  byte local_21;
  Surface *pSStack_20;
  bool logging_local;
  Surface *layer_local;
  LayeredRenderCase *this_local;
  
  local_21 = logging;
  pSStack_20 = layer;
  layer_local = (Surface *)this;
  if (logging) {
    pTVar4 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1a8,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<(&local_1a8,(char (*) [22])"Expecting empty image");
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1a8);
  }
  color.m_value = 0;
  do {
    RVar1.m_value = color.m_value;
    iVar2 = tcu::Surface::getHeight(pSStack_20);
    if (iVar2 <= (int)RVar1.m_value) {
      if ((local_21 & 1) != 0) {
        pTVar4 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_638,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar5 = tcu::MessageBuilder::operator<<(&local_638,(char (*) [15])"Image is valid");
        tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_638);
      }
      return true;
    }
    for (threshold = 0; iVar2 = threshold, iVar3 = tcu::Surface::getWidth(pSStack_20), iVar2 < iVar3
        ; threshold = threshold + 1) {
      RStack_1c0 = tcu::Surface::getPixel(pSStack_20,threshold,color.m_value);
      local_1c4 = 8;
      iVar2 = tcu::RGBA::getRed(&stack0xfffffffffffffe40);
      local_659 = true;
      if (8 < iVar2) {
        iVar2 = tcu::RGBA::getGreen(&stack0xfffffffffffffe40);
        local_659 = true;
        if (8 < iVar2) {
          iVar2 = tcu::RGBA::getBlue(&stack0xfffffffffffffe40);
          local_659 = iVar2 < 9;
        }
      }
      local_1c5 = local_659;
      if (local_659 == false) {
        if ((local_21 & 1) != 0) {
          pTVar4 = tcu::TestContext::getLog
                             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_348,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar5 = tcu::MessageBuilder::operator<<
                             (&local_348,(char (*) [35])"Found (at least) one bad pixel at ");
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&threshold);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0xf95497);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(int *)&color);
          pMVar5 = tcu::MessageBuilder::operator<<
                             (pMVar5,(char (*) [39])". Pixel color is not background color.");
          pTVar4 = tcu::MessageBuilder::operator<<
                             (pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3a8,"LayerContent",&local_3a9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3d0,"Layer content",&local_3d1);
          tcu::LogImageSet::LogImageSet(&local_388,&local_3a8,&local_3d0);
          pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_388);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_488,"Layer",&local_489);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_4b0,"Layer",&local_4b1);
          tcu::LogImage::LogImage
                    (&local_468,&local_488,&local_4b0,pSStack_20,QP_IMAGE_COMPRESSION_MODE_BEST);
          pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_468);
          tcu::TestLog::operator<<(pTVar4,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
          tcu::LogImage::~LogImage(&local_468);
          std::__cxx11::string::~string((string *)&local_4b0);
          std::allocator<char>::~allocator(&local_4b1);
          std::__cxx11::string::~string((string *)&local_488);
          std::allocator<char>::~allocator(&local_489);
          tcu::LogImageSet::~LogImageSet(&local_388);
          std::__cxx11::string::~string((string *)&local_3d0);
          std::allocator<char>::~allocator(&local_3d1);
          std::__cxx11::string::~string((string *)&local_3a8);
          std::allocator<char>::~allocator(&local_3a9);
          tcu::MessageBuilder::~MessageBuilder(&local_348);
        }
        return false;
      }
    }
    color.m_value = color.m_value + 1;
  } while( true );
}

Assistant:

bool LayeredRenderCase::verifyEmptyImage (const tcu::Surface& layer, bool logging)
{
	// Expect black
	if (logging)
		m_testCtx.getLog() << tcu::TestLog::Message << "Expecting empty image" << tcu::TestLog::EndMessage;

	for (int y = 0; y < layer.getHeight(); ++y)
	for (int x = 0; x < layer.getWidth(); ++x)
	{
		const tcu::RGBA color		= layer.getPixel(x, y);
		const int		threshold	= 8;
		const bool		isBlack		= color.getRed() <= threshold || color.getGreen() <= threshold || color.getBlue() <= threshold;

		if (!isBlack)
		{
			if (logging)
				m_testCtx.getLog()	<< tcu::TestLog::Message
									<< "Found (at least) one bad pixel at " << x << "," << y << ". Pixel color is not background color."
									<< tcu::TestLog::EndMessage
									<< tcu::TestLog::ImageSet("LayerContent", "Layer content")
									<< tcu::TestLog::Image("Layer", "Layer", layer)
									<< tcu::TestLog::EndImageSet;
			return false;
		}
	}

	if (logging)
		m_testCtx.getLog() << tcu::TestLog::Message << "Image is valid" << tcu::TestLog::EndMessage;

	return true;
}